

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysdep-unix.c
# Opt level: O3

void * scheduler_thread_proc_for_system_worker(void *arg)

{
  global_state_t *g;
  local_state *plVar1;
  int iVar2;
  cilk_fiber_data *fdata;
  __cilkrts_worker *w;
  cilk_fiber *pcVar3;
  char var;
  char local_19;
  
  g = *arg;
  w = allocate_make_worker(g,*(int *)((long)arg + 8));
  plVar1 = w->l;
  plVar1->type = WORKER_SYSTEM;
  plVar1->signal_node = *(signal_node_t **)((long)arg + 0x10);
  g->workers[w->self] = w;
  LOCK();
  UNLOCK();
  if (w->l->type == WORKER_SYSTEM) {
    __cilkrts_set_tls_worker(w);
    pcVar3 = cilk_fiber_allocate_from_thread();
    w->l->scheduling_fiber = pcVar3;
    (pcVar3->super_cilk_fiber_data).owner = w;
    __cilkrts_cilkscreen_establish_c_stack(&stack0xfffffffffff0bda7,&local_19);
    __cilkrts_run_scheduler_with_exceptions(w);
    iVar2 = cilk_fiber_deallocate_from_thread(w->l->scheduling_fiber);
    if (iVar2 == 0) {
      w->l->scheduling_fiber = (cilk_fiber *)0x0;
      return (void *)0x0;
    }
  }
  else {
    scheduler_thread_proc_for_system_worker_cold_1();
  }
  scheduler_thread_proc_for_system_worker_cold_2();
}

Assistant:

NON_COMMON void* scheduler_thread_proc_for_system_worker(void *arg)
{
    /*int status;*/
    __cilkrts_worker *w;
    worker_thread_arg_t* thread_arg = (struct worker_thread_arg*)arg;
    global_state_t * g = thread_arg->g;
    w = allocate_make_worker(g, thread_arg->self);

    /* make_worker_systems */
    w->l->type = WORKER_SYSTEM;
    /* pass the signal node to the worker */
    w->l->signal_node = thread_arg->signal_node;

    /* publish itself to the global*/
    g->workers[w->self] = w;
    __cilkrts_fence();

#ifdef __INTEL_COMPILER
#ifdef USE_ITTNOTIFY
    // Name the threads for Advisor.  They don't want a worker number.
    __itt_thread_set_name("Cilk Worker");
#endif // defined USE_ITTNOTIFY
#endif // defined __INTEL_COMPILER

    /* Worker startup is serialized
    status = pthread_mutex_lock(&__cilkrts_global_mutex);
    CILK_ASSERT(status == 0);*/
    CILK_ASSERT(w->l->type == WORKER_SYSTEM);
    /*status = pthread_mutex_unlock(&__cilkrts_global_mutex);
    CILK_ASSERT(status == 0);*/
    
    __cilkrts_set_tls_worker(w);

    START_INTERVAL(w, INTERVAL_IN_SCHEDULER);
    START_INTERVAL(w, INTERVAL_IN_RUNTIME);
    START_INTERVAL(w, INTERVAL_INIT_WORKER);

    // Create a cilk fiber for this worker on this thread.
    START_INTERVAL(w, INTERVAL_FIBER_ALLOCATE_FROM_THREAD) {
        w->l->scheduling_fiber = cilk_fiber_allocate_from_thread();
        cilk_fiber_set_owner(w->l->scheduling_fiber, w);
    } STOP_INTERVAL(w, INTERVAL_FIBER_ALLOCATE_FROM_THREAD);

    STOP_INTERVAL(w, INTERVAL_INIT_WORKER);
    
    internal_run_scheduler_with_exceptions(w);

    START_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE_FROM_THREAD) {
        // Deallocate the scheduling fiber.  This operation reverses the
        // effect cilk_fiber_allocate_from_thread() and must be done in this
        // thread before it exits.
        int ref_count = cilk_fiber_deallocate_from_thread(w->l->scheduling_fiber);
        // Scheduling fibers should never have extra references to them.
        // We only get extra references into fibers because of Windows
        // exceptions.
        CILK_ASSERT(0 == ref_count);
        w->l->scheduling_fiber = NULL;
    } STOP_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE_FROM_THREAD);
    
    STOP_INTERVAL(w, INTERVAL_IN_RUNTIME);
    STOP_INTERVAL(w, INTERVAL_IN_SCHEDULER);
    return 0;
}